

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiplexEpoll.cpp
# Opt level: O2

void __thiscall higan::MultiplexEpoll::MultiplexEpoll(MultiplexEpoll *this)

{
  int iVar1;
  allocator_type local_19;
  
  MultiplexBase::MultiplexBase(&this->super_MultiplexBase);
  (this->super_MultiplexBase)._vptr_MultiplexBase = (_func_int **)&PTR_UpdateChannel_0011ac10;
  iVar1 = epoll_create(5);
  this->epollfd_ = iVar1;
  std::vector<epoll_event,_std::allocator<epoll_event>_>::vector(&this->epoll_events_,100,&local_19)
  ;
  return;
}

Assistant:

MultiplexEpoll::MultiplexEpoll():
		epollfd_(epoll_create(5)),
		epoll_events_(EPOLL_MAX_EVNETS)
{
	
}